

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::zetDebugWriteMemory
          (validation_layer *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread,
          zet_debug_memory_space_desc_t *desc,size_t size,void *buffer)

{
  code *pcVar1;
  ze_device_thread_t thread_00;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this_00;
  size_type sVar3;
  reference ppvVar4;
  pointer pHVar5;
  size_type sStack_d8;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  size_type sStack_90;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  zet_pfnDebugWriteMemory_t pfnWriteMemory;
  allocator local_61;
  string local_60 [32];
  void *local_40;
  void *buffer_local;
  size_t size_local;
  zet_debug_memory_space_desc_t *desc_local;
  zet_debug_session_handle_t hDebug_local;
  ze_device_thread_t thread_local;
  
  size_local = thread._8_8_;
  thread_local._0_8_ = thread._0_8_;
  local_40 = (void *)size;
  buffer_local = desc;
  desc_local = (zet_debug_memory_space_desc_t *)this;
  unique0x10000245 = hDebug;
  this_00 = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_60,"zetDebugWriteMemory(hDebug, thread, desc, size, buffer)",&local_61);
  loader::Logger::log_trace(this_00,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pcVar1 = *(code **)(context + 0x860);
  if (pcVar1 == (code *)0x0) {
    thread_local.eu =
         logAndPropagateResult("zetDebugWriteMemory",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (sStack_90 = 0; sStack_90 < sVar3; sStack_90 = sStack_90 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_90);
      zVar2 = (*(*ppvVar4)->zetValidation->_vptr_ZETValidationEntryPoints[0x12])
                        ((*ppvVar4)->zetValidation,desc_local,stack0xffffffffffffffe4,
                         thread_local._0_8_,size_local,buffer_local,local_40);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zetDebugWriteMemory",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      thread_00.eu = thread_local.slice;
      thread_00.thread = thread_local.subslice;
      thread_00._0_8_ = stack0xffffffffffffffe4;
      zVar2 = ZETHandleLifetimeValidation::zetDebugWriteMemoryPrologue
                        (&pHVar5->zetHandleLifetime,(zet_debug_session_handle_t)desc_local,thread_00
                         ,(zet_debug_memory_space_desc_t *)size_local,(size_t)buffer_local,local_40)
      ;
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zetDebugWriteMemory",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(desc_local,stack0xffffffffffffffe4,thread_local._0_8_,size_local,buffer_local,
                      local_40);
    for (sStack_d8 = 0; sStack_d8 < sVar3; sStack_d8 = sStack_d8 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_d8);
      result_00 = (*(*ppvVar4)->zetValidation->_vptr_ZETValidationEntryPoints[0x13])
                            ((*ppvVar4)->zetValidation,desc_local,stack0xffffffffffffffe4,
                             thread_local._0_8_,size_local,buffer_local,local_40,zVar2);
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zetDebugWriteMemory",result_00);
        return zVar2;
      }
    }
    thread_local.eu = logAndPropagateResult("zetDebugWriteMemory",zVar2);
  }
  return thread_local.eu;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugWriteMemory(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread,                      ///< [in] the thread identifier.
        const zet_debug_memory_space_desc_t* desc,      ///< [in] memory space descriptor
        size_t size,                                    ///< [in] the number of bytes to write
        const void* buffer                              ///< [in] a buffer holding the pattern to write
        )
    {
        context.logger->log_trace("zetDebugWriteMemory(hDebug, thread, desc, size, buffer)");

        auto pfnWriteMemory = context.zetDdiTable.Debug.pfnWriteMemory;

        if( nullptr == pfnWriteMemory )
            return logAndPropagateResult("zetDebugWriteMemory", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetDebugWriteMemoryPrologue( hDebug, thread, desc, size, buffer );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetDebugWriteMemory", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetDebugWriteMemoryPrologue( hDebug, thread, desc, size, buffer );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetDebugWriteMemory", result);
        }

        auto driver_result = pfnWriteMemory( hDebug, thread, desc, size, buffer );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetDebugWriteMemoryEpilogue( hDebug, thread, desc, size, buffer ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetDebugWriteMemory", result);
        }

        return logAndPropagateResult("zetDebugWriteMemory", driver_result);
    }